

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader.hpp
# Opt level: O0

ssize_t __thiscall
jsoncons::csv::basic_csv_reader<char,_jsoncons::string_source<char>,_std::allocator<char>_>::read
          (basic_csv_reader<char,_jsoncons::string_source<char>,_std::allocator<char>_> *this,
          int __fd,void *__buf,size_t __nbytes)

{
  error_code ec_00;
  bool bVar1;
  undefined7 extraout_var;
  undefined8 uVar2;
  void *__buf_00;
  basic_csv_parser<char,_std::allocator<char>_> *this_00;
  error_code ec;
  error_code *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffc8;
  ser_error *in_stack_ffffffffffffffd0;
  error_code local_18;
  basic_csv_reader<char,_jsoncons::string_source<char>,_std::allocator<char>_> *local_8;
  
  local_8 = this;
  std::error_code::error_code(in_stack_ffffffffffffffa0);
  read(this,(int)&local_18,__buf_00,__nbytes);
  bVar1 = std::error_code::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    return CONCAT71(extraout_var,bVar1);
  }
  uVar2 = __cxa_allocate_exception(0x58);
  this_00 = &this->parser_;
  basic_csv_parser<char,_std::allocator<char>_>::line(this_00);
  basic_csv_parser<char,_std::allocator<char>_>::column(this_00);
  ec_00._M_cat = local_18._M_cat;
  ec_00._M_value = local_18._M_value;
  ec_00._4_4_ = local_18._4_4_;
  ser_error::ser_error(in_stack_ffffffffffffffd0,ec_00,in_stack_ffffffffffffffc8,(size_t)this);
  __cxa_throw(uVar2,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

void read()
        {
            std::error_code ec;
            read(ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                JSONCONS_THROW(ser_error(ec,parser_.line(),parser_.column()));
            }
        }